

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

uint8_t * BrotliDecoderTakeOutput(BrotliDecoderStateInternal *s,size_t *size)

{
  BrotliDecoderErrorCode e;
  size_t local_48;
  BrotliDecoderErrorCode status;
  size_t requested_out;
  size_t available_out;
  uint8_t *result;
  size_t *size_local;
  BrotliDecoderStateInternal *s_local;
  
  available_out = 0;
  if (*size == 0) {
    local_48 = 0x1000000;
  }
  else {
    local_48 = *size;
  }
  requested_out = local_48;
  if ((s->ringbuffer == (uint8_t *)0x0) || (s->error_code < 0)) {
    *size = 0;
    s_local = (BrotliDecoderStateInternal *)0x0;
  }
  else {
    result = (uint8_t *)size;
    size_local = (size_t *)s;
    WrapRingBuffer(s);
    e = WriteRingBuffer((BrotliDecoderStateInternal *)size_local,&requested_out,
                        (uint8_t **)&available_out,(size_t *)0x0,1);
    if ((e == BROTLI_DECODER_SUCCESS) || (e == BROTLI_DECODER_NEEDS_MORE_OUTPUT)) {
      *(size_t *)result = local_48 - requested_out;
    }
    else {
      if (e < BROTLI_DECODER_NO_ERROR) {
        SaveErrorCode((BrotliDecoderStateInternal *)size_local,e);
      }
      result[0] = '\0';
      result[1] = '\0';
      result[2] = '\0';
      result[3] = '\0';
      result[4] = '\0';
      result[5] = '\0';
      result[6] = '\0';
      result[7] = '\0';
      available_out = 0;
    }
    s_local = (BrotliDecoderStateInternal *)available_out;
  }
  return (uint8_t *)s_local;
}

Assistant:

const uint8_t* BrotliDecoderTakeOutput(BrotliDecoderState* s, size_t* size) {
  uint8_t* result = 0;
  size_t available_out = *size ? *size : 1u << 24;
  size_t requested_out = available_out;
  BrotliDecoderErrorCode status;
  if ((s->ringbuffer == 0) || ((int)s->error_code < 0)) {
    *size = 0;
    return 0;
  }
  WrapRingBuffer(s);
  status = WriteRingBuffer(s, &available_out, &result, 0, BROTLI_TRUE);
  /* Either WriteRingBuffer returns those "success" codes... */
  if (status == BROTLI_DECODER_SUCCESS ||
      status == BROTLI_DECODER_NEEDS_MORE_OUTPUT) {
    *size = requested_out - available_out;
  } else {
    /* ... or stream is broken. Normally this should be caught by
       BrotliDecoderDecompressStream, this is just a safeguard. */
    if ((int)status < 0) SaveErrorCode(s, status);
    *size = 0;
    result = 0;
  }
  return result;
}